

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

int secp256k1_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  secp256k1_ecmult_gen_context *a_00;
  char cVar7;
  int iVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  long lVar9;
  uchar *in_RCX;
  secp256k1_ecmult_gen_context *hasher;
  secp256k1_fe *data;
  ulong uVar10;
  secp256k1_pubkey *pubkey;
  secp256k1_ge *extraout_RDX;
  uchar *seckey;
  uint uVar11;
  uint64_t uVar12;
  uchar *u32;
  ulong uVar13;
  secp256k1_ge *u32_00;
  secp256k1_context *ctx;
  ulong uVar14;
  ulong uVar15;
  secp256k1_ge *elem;
  secp256k1_ecmult_gen_context *psVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  ulong uVar19;
  secp256k1_fe *a_01;
  uint64_t uVar20;
  undefined1 auVar21 [16];
  secp256k1_fe na;
  secp256k1_scalar sStack_3f0;
  secp256k1_ge sStack_3c8;
  secp256k1_sha256 sStack_360;
  secp256k1_fe sStack_2f8;
  ulong uStack_2c8;
  secp256k1_ge *psStack_2c0;
  ulong uStack_2b8;
  secp256k1_fe *psStack_2b0;
  secp256k1_ecmult_gen_context *psStack_2a8;
  secp256k1_fe *psStack_2a0;
  secp256k1_ge *psStack_290;
  secp256k1_ecmult_gen_context *psStack_288;
  long lStack_280;
  secp256k1_fe sStack_278;
  byte abStack_248 [40];
  uchar *puStack_220;
  uint64_t uStack_218;
  uint64_t uStack_210;
  uchar *puStack_208;
  secp256k1_fe *psStack_200;
  code *pcStack_1f8;
  size_t sStack_1e8;
  secp256k1_sha256 sStack_1e0;
  undefined1 auStack_170 [224];
  secp256k1_fe *psStack_90;
  secp256k1_fe *psStack_88;
  secp256k1_fe *psStack_80;
  uint64_t local_70;
  uint64_t local_68;
  secp256k1_fe local_60;
  
  psStack_80 = (secp256k1_fe *)0x12023d;
  secp256k1_fe_verify(a);
  psStack_80 = (secp256k1_fe *)0x120245;
  secp256k1_fe_verify(b);
  psStack_80 = (secp256k1_fe *)0x120252;
  secp256k1_fe_verify_magnitude(a,1);
  psStack_80 = (secp256k1_fe *)0x12025f;
  secp256k1_fe_verify_magnitude(b,0x1f);
  psStack_80 = (secp256k1_fe *)0x120267;
  secp256k1_fe_verify(a);
  u32 = (uchar *)0x1;
  psStack_80 = (secp256k1_fe *)0x120274;
  secp256k1_fe_verify_magnitude(a,1);
  local_68 = 0x3ffffbfffff0bc - a->n[0];
  uVar17 = 0x3ffffffffffffc - a->n[1];
  uVar12 = 0x3ffffffffffffc - a->n[2];
  local_70 = 0x3ffffffffffffc - a->n[3];
  uVar18 = 0x3fffffffffffc - a->n[4];
  local_60.magnitude = 2;
  local_60.normalized = 0;
  psStack_80 = (secp256k1_fe *)0x1202dd;
  local_60.n[0] = local_68;
  local_60.n[1] = uVar17;
  local_60.n[2] = uVar12;
  local_60.n[3] = local_70;
  local_60.n[4] = uVar18;
  secp256k1_fe_verify(&local_60);
  psStack_80 = (secp256k1_fe *)0x1202e5;
  secp256k1_fe_verify(&local_60);
  psStack_80 = (secp256k1_fe *)0x1202ed;
  ctx = (secp256k1_context *)b;
  secp256k1_fe_verify(b);
  if (b->magnitude < 0x1f) {
    uVar20 = local_68 + b->n[0];
    uVar17 = uVar17 + b->n[1];
    uVar12 = uVar12 + b->n[2];
    local_70 = local_70 + b->n[3];
    uVar19 = uVar18 + b->n[4];
    local_60.normalized = 0;
    local_60.magnitude = b->magnitude + 2;
    psStack_80 = (secp256k1_fe *)0x12034a;
    local_60.n[0] = uVar20;
    local_60.n[1] = uVar17;
    local_60.n[2] = uVar12;
    local_60.n[3] = local_70;
    local_60.n[4] = uVar19;
    secp256k1_fe_verify(&local_60);
    psStack_80 = (secp256k1_fe *)0x120352;
    secp256k1_fe_verify(&local_60);
    uVar13 = (uVar19 >> 0x30) * 0x1000003d1 + uVar20;
    uVar10 = (uVar13 >> 0x34) + uVar17;
    uVar14 = (uVar10 >> 0x34) + uVar12;
    uVar15 = (uVar14 >> 0x34) + local_70;
    uVar19 = (uVar15 >> 0x34) + (uVar19 & 0xffffffffffff);
    return (int)(((uVar13 ^ 0x1000003d0) & uVar10 & uVar14 & uVar15 & (uVar19 ^ 0xf000000000000)) ==
                 0xfffffffffffff ||
                ((uVar10 | uVar13 | uVar14 | uVar15) & 0xfffffffffffff) == 0 && uVar19 == 0);
  }
  psStack_80 = (secp256k1_fe *)secp256k1_ellswift_encode;
  secp256k1_fe_equal_cold_1();
  psStack_90 = b;
  psStack_88 = a;
  psStack_80 = &local_60;
  if (ctx == (secp256k1_context *)0x0) {
    pcStack_1f8 = (code *)0x120525;
    secp256k1_ellswift_encode_cold_5();
  }
  else if (u32 != (uchar *)0x0) {
    if (pubkey == (secp256k1_pubkey *)0x0) {
      pcStack_1f8 = (code *)0x120531;
      secp256k1_ellswift_encode_cold_3();
      return 0;
    }
    if (in_RCX == (uchar *)0x0) {
      pcStack_1f8 = (code *)0x120538;
      secp256k1_ellswift_encode_cold_2();
      return 0;
    }
    pcStack_1f8 = (code *)0x120436;
    iVar8 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)(auStack_170 + 0x48),pubkey);
    if (iVar8 == 0) {
      u32[0x30] = '\0';
      u32[0x31] = '\0';
      u32[0x32] = '\0';
      u32[0x33] = '\0';
      u32[0x34] = '\0';
      u32[0x35] = '\0';
      u32[0x36] = '\0';
      u32[0x37] = '\0';
      u32[0x38] = '\0';
      u32[0x39] = '\0';
      u32[0x3a] = '\0';
      u32[0x3b] = '\0';
      u32[0x3c] = '\0';
      u32[0x3d] = '\0';
      u32[0x3e] = '\0';
      u32[0x3f] = '\0';
      u32[0x20] = '\0';
      u32[0x21] = '\0';
      u32[0x22] = '\0';
      u32[0x23] = '\0';
      u32[0x24] = '\0';
      u32[0x25] = '\0';
      u32[0x26] = '\0';
      u32[0x27] = '\0';
      u32[0x28] = '\0';
      u32[0x29] = '\0';
      u32[0x2a] = '\0';
      u32[0x2b] = '\0';
      u32[0x2c] = '\0';
      u32[0x2d] = '\0';
      u32[0x2e] = '\0';
      u32[0x2f] = '\0';
      u32[0x10] = '\0';
      u32[0x11] = '\0';
      u32[0x12] = '\0';
      u32[0x13] = '\0';
      u32[0x14] = '\0';
      u32[0x15] = '\0';
      u32[0x16] = '\0';
      u32[0x17] = '\0';
      u32[0x18] = '\0';
      u32[0x19] = '\0';
      u32[0x1a] = '\0';
      u32[0x1b] = '\0';
      u32[0x1c] = '\0';
      u32[0x1d] = '\0';
      u32[0x1e] = '\0';
      u32[0x1f] = '\0';
      u32[0] = '\0';
      u32[1] = '\0';
      u32[2] = '\0';
      u32[3] = '\0';
      u32[4] = '\0';
      u32[5] = '\0';
      u32[6] = '\0';
      u32[7] = '\0';
      u32[8] = '\0';
      u32[9] = '\0';
      u32[10] = '\0';
      u32[0xb] = '\0';
      u32[0xc] = '\0';
      u32[0xd] = '\0';
      u32[0xe] = '\0';
      u32[0xf] = '\0';
      return 0;
    }
    psVar16 = (secp256k1_ecmult_gen_context *)auStack_170;
    auStack_170._48_8_ = 0;
    auStack_170._56_8_ = 0;
    auStack_170._32_8_ = 0;
    auStack_170._40_8_ = 0;
    auStack_170._16_8_ = 0;
    auStack_170._24_8_ = 0;
    auStack_170._0_8_ = 0;
    auStack_170._8_8_ = 0;
    sStack_1e0.s[0] = 0xd1a6524b;
    sStack_1e0.s[1] = 0x28594b3;
    sStack_1e0.s[2] = 0x96e42f4e;
    sStack_1e0.s[3] = 0x1037a177;
    sStack_1e0.s[4] = 0x1b8fcb8b;
    sStack_1e0.s[5] = 0x56023885;
    sStack_1e0.s[6] = 0x2560ede1;
    sStack_1e0.s[7] = 0xd626b715;
    sStack_1e0.bytes = 0x40;
    elem = (secp256k1_ge *)(auStack_170 + 0x48);
    hasher = (secp256k1_ecmult_gen_context *)0x1;
    pcStack_1f8 = (code *)0x120490;
    iVar8 = secp256k1_eckey_pubkey_serialize(elem,(uchar *)psVar16,&sStack_1e8,1);
    if ((iVar8 != 0) && (sStack_1e8 == 0x21)) {
      pcStack_1f8 = (code *)0x1204be;
      secp256k1_sha256_write(&sStack_1e0,auStack_170,0x40);
      pcStack_1f8 = (code *)0x1204ce;
      secp256k1_sha256_write(&sStack_1e0,in_RCX,0x20);
      pcStack_1f8 = (code *)0x1204ec;
      secp256k1_ellswift_elligatorswift_var
                (u32,(secp256k1_fe *)(auStack_170 + 0xb0),(secp256k1_ge *)(auStack_170 + 0x48),
                 &sStack_1e0);
      pcStack_1f8 = (code *)0x1204fb;
      secp256k1_fe_get_b32(u32 + 0x20,(secp256k1_fe *)(auStack_170 + 0xb0));
      return 1;
    }
    pcStack_1f8 = secp256k1_ellswift_elligatorswift_var;
    secp256k1_ellswift_encode_cold_1();
    pcStack_1f8 = (code *)uVar12;
    psStack_200 = &local_60;
    puStack_208 = in_RCX;
    uStack_210 = uVar18;
    uStack_218 = uVar17;
    puStack_220 = u32;
    uVar13 = 0;
    lStack_280 = 0x1000003d1;
    uVar10 = 0;
    psStack_290 = extraout_RDX;
    psStack_288 = psVar16;
    do {
      iVar8 = (int)uVar10;
      if (iVar8 == 0) {
        psStack_2a0 = (secp256k1_fe *)0x120591;
        secp256k1_ellswift_prng(abStack_248,(secp256k1_sha256 *)hasher,(uint32_t)uVar13);
        iVar8 = 0x40;
        uVar13 = (ulong)((uint32_t)uVar13 + 1);
      }
      uVar11 = iVar8 - 1;
      uVar10 = (ulong)uVar11;
      bVar3 = abStack_248[uVar11 >> 1];
      a_01 = (secp256k1_fe *)(ulong)bVar3;
      psStack_2a0 = (secp256k1_fe *)0x1205b3;
      secp256k1_ellswift_prng((uchar *)elem,(secp256k1_sha256 *)hasher,(uint32_t)uVar13);
      psStack_2a0 = (secp256k1_fe *)0x1205be;
      secp256k1_fe_impl_set_b32_mod(&sStack_278,(uchar *)elem);
      sStack_278.magnitude = 1;
      sStack_278.normalized = 0;
      psStack_2a0 = (secp256k1_fe *)0x1205cf;
      secp256k1_fe_verify(&sStack_278);
      psStack_2a0 = (secp256k1_fe *)0x1205d7;
      secp256k1_fe_verify(&sStack_278);
      uVar14 = (sStack_278.n[4] >> 0x30) * lStack_280 + sStack_278.n[0];
      if (((uVar14 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar14 & 0xfffffffffffff) == 0)) {
        uVar15 = (uVar14 >> 0x34) + sStack_278.n[1];
        u32_00 = (secp256k1_ge *)((uVar15 >> 0x34) + sStack_278.n[2]);
        psVar16 = (secp256k1_ecmult_gen_context *)(((ulong)u32_00 >> 0x34) + sStack_278.n[3]);
        uVar19 = ((ulong)psVar16 >> 0x34) + (sStack_278.n[4] & 0xffffffffffff);
        data = (secp256k1_fe *)
               ((uVar15 | uVar14 | (ulong)u32_00 | (ulong)psVar16) & 0xfffffffffffff | uVar19);
        if ((data == (secp256k1_fe *)0x0) ||
           (data = (secp256k1_fe *)0x1000003d0,
           ((uVar14 | 0x1000003d0) & uVar15 & (ulong)u32_00 & (ulong)psVar16 &
           (uVar19 ^ 0xf000000000000)) == 0xfffffffffffff)) {
          psStack_2a0 = (secp256k1_fe *)0x1207a1;
          secp256k1_ellswift_elligatorswift_var_cold_1();
          goto LAB_001207a1;
        }
      }
      uVar13 = (ulong)((uint32_t)uVar13 + 1);
      uVar11 = bVar3 >> ((char)uVar11 * '\x04' & 4U) & 7;
      a_01 = (secp256k1_fe *)(ulong)uVar11;
      psStack_2a0 = (secp256k1_fe *)0x1206c1;
      data = a_01;
      u32_00 = psStack_290;
      iVar8 = secp256k1_ellswift_xswiftec_inv_var
                        ((secp256k1_fe *)psStack_288,&psStack_290->x,&sStack_278,uVar11);
      a_00 = psStack_288;
      if (iVar8 != 0) {
        psStack_2a0 = (secp256k1_fe *)0x1206d6;
        secp256k1_fe_normalize_var((secp256k1_fe *)psStack_288);
        psStack_2a0 = (secp256k1_fe *)0x1206de;
        psVar16 = a_00;
        secp256k1_fe_verify((secp256k1_fe *)a_00);
        hasher = a_00;
        if (*(int *)((long)(a_00->ge_offset).x.n + 4) == 0) {
LAB_001207a1:
          psStack_2a0 = (secp256k1_fe *)0x1207a6;
          secp256k1_ellswift_elligatorswift_var_cold_3();
        }
        else {
          uVar10 = *(ulong *)a_00;
          a_01 = &psStack_290->y;
          psStack_2a0 = (secp256k1_fe *)0x1206fe;
          psVar16 = (secp256k1_ecmult_gen_context *)a_01;
          secp256k1_fe_verify(a_01);
          elem = psStack_290;
          if ((psStack_290->y).normalized != 0) {
            if ((((uint)uVar10 ^ (uint)a_01->n[0]) & 1) != 0) {
              psStack_2a0 = (secp256k1_fe *)0x120729;
              secp256k1_fe_verify((secp256k1_fe *)a_00);
              psStack_2a0 = (secp256k1_fe *)0x120736;
              secp256k1_fe_verify_magnitude((secp256k1_fe *)a_00,1);
              uVar12 = (a_00->scalar_offset).d[0];
              uVar17 = (a_00->scalar_offset).d[1];
              uVar18 = (a_00->scalar_offset).d[2];
              *(long *)a_00 = 0x3ffffbfffff0bc - *(long *)a_00;
              (a_00->scalar_offset).d[0] = 0x3ffffffffffffc - uVar12;
              (a_00->scalar_offset).d[1] = 0x3ffffffffffffc - uVar17;
              (a_00->scalar_offset).d[2] = 0x3ffffffffffffc - uVar18;
              (a_00->scalar_offset).d[3] = 0x3fffffffffffc - (a_00->scalar_offset).d[3];
              (a_00->ge_offset).x.n[0] = 2;
              psStack_2a0 = (secp256k1_fe *)0x120786;
              secp256k1_fe_verify((secp256k1_fe *)a_00);
              secp256k1_fe_normalize_var((secp256k1_fe *)a_00);
              return extraout_EAX_00;
            }
            return extraout_EAX;
          }
        }
        psStack_2a0 = (secp256k1_fe *)secp256k1_ellswift_create;
        secp256k1_ellswift_elligatorswift_var_cold_2();
        uStack_2c8 = uVar10;
        psStack_2c0 = elem;
        uStack_2b8 = uVar13;
        psStack_2b0 = a_01;
        psStack_2a8 = hasher;
        psStack_2a0 = &sStack_278;
        if (psVar16 == (secp256k1_ecmult_gen_context *)0x0) {
          secp256k1_ellswift_create_cold_6();
        }
        else if (u32_00 != (secp256k1_ge *)0x0) {
          (u32_00->y).n[0] = 0;
          (u32_00->y).n[1] = 0;
          *(undefined1 (*) [16])((u32_00->x).n + 4) = (undefined1  [16])0x0;
          (u32_00->x).n[2] = 0;
          (u32_00->x).n[3] = 0;
          (u32_00->x).n[0] = 0;
          (u32_00->x).n[1] = 0;
          if (psVar16->built == 0) {
            secp256k1_ellswift_create_cold_4();
            return 0;
          }
          if (seckey == (uchar *)0x0) {
            secp256k1_ellswift_create_cold_3();
            return 0;
          }
          iVar8 = secp256k1_ec_pubkey_create_helper(psVar16,&sStack_3f0,&sStack_3c8,seckey);
          if ((int)psVar16[1].scalar_offset.d[3] != 0) {
            secp256k1_ellswift_create_cold_1();
          }
          secp256k1_fe_normalize_var(&sStack_3c8.x);
          secp256k1_fe_normalize_var(&sStack_3c8.y);
          sStack_360.s[0] = 0xd29e1bf5;
          sStack_360.s[1] = 0xf7025f42;
          sStack_360.s[2] = 0x9b024773;
          sStack_360.s[3] = 0x94cb7d5;
          sStack_360.s[4] = 0xe59ed789;
          sStack_360.s[5] = 0x3bc9786;
          sStack_360.s[6] = 0x68335b35;
          sStack_360.s[7] = 0x4e363b53;
          sStack_360.bytes = 0x40;
          secp256k1_sha256_write(&sStack_360,seckey,0x20);
          secp256k1_sha256_write(&sStack_360,"",0x20);
          if ((int)psVar16[1].scalar_offset.d[3] != 0) {
            secp256k1_ellswift_create_cold_2();
          }
          if (data != (secp256k1_fe *)0x0) {
            secp256k1_sha256_write(&sStack_360,(uchar *)data,0x20);
          }
          secp256k1_ellswift_elligatorswift_var((uchar *)u32_00,&sStack_2f8,&sStack_3c8,&sStack_360)
          ;
          secp256k1_fe_get_b32((uchar *)((u32_00->x).n + 4),&sStack_2f8);
          cVar7 = ((byte)iVar8 ^ 1) - 1;
          auVar21 = ZEXT216(CONCAT11(cVar7,cVar7));
          auVar21 = pshuflw(auVar21,auVar21,0);
          uVar11 = auVar21._0_4_;
          lVar9 = 0;
          do {
            puVar1 = (uint *)((long)(u32_00->x).n + lVar9);
            uVar4 = puVar1[1];
            uVar5 = puVar1[2];
            uVar6 = puVar1[3];
            puVar2 = (uint *)((long)(u32_00->x).n + lVar9);
            *puVar2 = *puVar1 & uVar11;
            puVar2[1] = uVar4 & uVar11;
            puVar2[2] = uVar5 & uVar11;
            puVar2[3] = uVar6 & uVar11;
            lVar9 = lVar9 + 0x10;
          } while (lVar9 != 0x40);
          return iVar8;
        }
        secp256k1_ellswift_create_cold_5();
        return 0;
      }
    } while( true );
  }
  pcStack_1f8 = (code *)0x12052a;
  secp256k1_ellswift_encode_cold_4();
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 31);

    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero(&na);
}